

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_avappendf(cargo_astr_t *str,char *format,__va_list_tag *ap)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  va_list apc;
  
  if (str == (cargo_astr_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x153,"int cargo_avappendf(cargo_astr_t *, const char *, struct __va_list_tag *)"
                 );
  }
  if (str->s != (char **)0x0) {
    if (*str->s == (char *)0x0) {
      sVar3 = str->l;
      if (sVar3 == 0) {
        str->l = 0x100;
        sVar3 = 0x100;
      }
      str->offset = 0;
      pcVar2 = (char *)_cargo_calloc(1,sVar3);
      *str->s = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
    }
    while( true ) {
      apc[0].reg_save_area = ap->reg_save_area;
      apc[0].gp_offset = ap->gp_offset;
      apc[0].fp_offset = ap->fp_offset;
      apc[0].overflow_arg_area = ap->overflow_arg_area;
      sVar3 = str->l - str->offset;
      str->diff = sVar3;
      uVar1 = cargo_vsnprintf(*str->s + str->offset,sVar3,format,apc);
      if ((int)uVar1 < 0) {
        return -1;
      }
      if ((ulong)uVar1 < str->diff) break;
      sVar3 = str->l * 2;
      if (str->l == 0) {
        sVar3 = 0x200;
      }
      str->l = sVar3;
      pcVar2 = (char *)_cargo_realloc(*str->s,sVar3);
      *str->s = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
    }
    str->offset = str->offset + (ulong)uVar1;
    return uVar1;
  }
  __assert_fail("str->s",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x154,"int cargo_avappendf(cargo_astr_t *, const char *, struct __va_list_tag *)");
}

Assistant:

int cargo_avappendf(cargo_astr_t *str, const char *format, va_list ap)
{
    int ret = 0;
    va_list apc;
    assert(str);
    assert(str->s);

    if (!(*str->s))
    {
        if (str->l == 0)
        {
            str->l = CARGO_ASTR_DEFAULT_SIZE;
        }

        str->offset = 0;

        if (!(*str->s = _cargo_calloc(1, str->l)))
        {
            CARGODBG(1, "Out of memory!\n");
            return -1;
        }
    }

    while (1)
    {
        // We must copy the va_list otherwise it will be
        // out of sync on a realloc.
        va_copy(apc, ap);

        str->diff = (str->l - str->offset);

        if ((ret = cargo_vsnprintf(&(*str->s)[str->offset],
                str->diff, format, apc)) < 0)
        {
            CARGODBG(1, "Formatting error\n");
            return -1;
        }

        va_end(apc);

        if ((size_t)ret >= str->diff)
        {
            if (str->l == 0) str->l = CARGO_ASTR_DEFAULT_SIZE;
            str->l *= 2;
            CARGODBG(4, "Realloc %lu\n", str->l);

            if (!(*str->s = _cargo_realloc(*str->s, str->l)))
            {
                CARGODBG(1, "Out of memory!\n");
                return -1;
            }

            continue;
        }

        break;
    }

    str->offset += ret;

    return ret;
}